

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * unixNextSystemCall(sqlite3_vfs *p,char *zName)

{
  sqlite3_syscall_ptr *pp_Var1;
  int iVar2;
  sqlite3_syscall_ptr *pp_Var3;
  long lVar4;
  long lVar5;
  unix_syscall *puVar6;
  
  if (zName == (char *)0x0) {
    lVar4 = -1;
  }
  else {
    puVar6 = aSyscall;
    lVar4 = 0;
    while ((lVar4 != 0x17 && (iVar2 = strcmp(zName,puVar6->zName), iVar2 != 0))) {
      lVar4 = lVar4 + 1;
      puVar6 = puVar6 + 1;
    }
  }
  lVar5 = lVar4 + -0x18;
  pp_Var1 = &aSyscall[lVar4 + 1].pCurrent;
  do {
    pp_Var3 = pp_Var1;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0) {
      return (char *)0x0;
    }
    pp_Var1 = pp_Var3 + 3;
  } while (*pp_Var3 == (sqlite3_syscall_ptr)0x0);
  return ((unix_syscall *)(pp_Var3 + -1))->zName;
}

Assistant:

static const char *unixNextSystemCall(sqlite3_vfs *p, const char *zName){
  int i = -1;

  UNUSED_PARAMETER(p);
  if( zName ){
    for(i=0; i<ArraySize(aSyscall)-1; i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ) break;
    }
  }
  for(i++; i<ArraySize(aSyscall); i++){
    if( aSyscall[i].pCurrent!=0 ) return aSyscall[i].zName;
  }
  return 0;
}